

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout_open.c
# Opt level: O1

int mpt_layout_open(mpt_output *out,char *desc,char *gen)

{
  _func_ssize_t_mpt_output_ptr_size_t_void_ptr *p_Var1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  mpt_msgtype mt;
  undefined1 local_22 [2];
  
  mpt_layout_open::lid = -1;
  if (((((gen != (char *)0x0) && (iVar2 = strcasecmp("file",gen), iVar2 != 0)) &&
       (iVar2 = strcasecmp("lay",gen), iVar2 != 0)) &&
      ((iVar2 = strcasecmp("layout",gen), iVar2 != 0 && (iVar2 = strcasecmp("gen",gen), iVar2 != 0))
      )) && (iVar2 = strcasecmp("generate",gen), iVar2 != 0)) {
    iVar2 = strcasecmp("create",gen);
    uVar5 = 0xffffffff;
    if (iVar2 != 0) goto LAB_00108415;
  }
  uVar3 = (*out->_vptr->await)(out,setLayout,&mpt_layout_open::lid);
  if ((int)uVar3 < 0) {
    uVar5 = (ulong)uVar3;
  }
  else {
    uVar5 = (*out->_vptr->push)(out,2,local_22);
    if (-1 < (long)uVar5) {
      if (desc != (char *)0x0) {
        p_Var1 = out->_vptr->push;
        sVar4 = strlen(desc);
        uVar5 = (*p_Var1)(out,sVar4 + 1,desc);
      }
      if (((long)uVar5 < 0) || (uVar5 = (*out->_vptr->push)(out,0,(void *)0x0), (long)uVar5 < 0)) {
        (*out->_vptr->push)(out,1,(void *)0x0);
      }
      else {
        (*out->_vptr->sync)(out,-1);
        uVar3 = 0;
        if (0 < mpt_layout_open::lid) {
          uVar3 = mpt_layout_open::lid;
        }
        uVar5 = (ulong)uVar3;
      }
    }
  }
LAB_00108415:
  return (int)uVar5;
}

Assistant:

extern int mpt_layout_open(MPT_INTERFACE(output) *out, const char *desc, const char *gen)
{
	static int lid;
	MPT_STRUCT(msgtype) mt;
	ssize_t len;
	int err;
	
	mt.cmd = MPT_MESGTYPE(Graphic);
	mt.arg = MPT_MESGGRF(LayoutOpen);
	
	lid = -1;
	
	/* specify generator mode */
	if (gen) {
		if (!strcasecmp("file", gen)) {
			mt.arg = MPT_MESGGRF(LayoutOpen);
		}
		else if (!strcasecmp("lay", gen) || !strcasecmp("layout", gen)) {
			mt.arg = MPT_MESGGRF(LayoutParse);
		}
		else if (!strcasecmp("gen", gen) || !strcasecmp("generate", gen) || !strcasecmp("create", gen)) {
			mt.arg = MPT_MESGGRF(LayoutCreate);
		}
		else {
			return -1;
		}
	}
	/* register layout id setter */
	if ((err = out->_vptr->await(out, setLayout, &lid)) < 0) {
		return err;
	}
	/* begin open operation */
	if ((len = out->_vptr->push(out, sizeof(mt), &mt)) < 0) {
		return len;
	}
	/* add layout description/filename */
	if (desc) {
		len = out->_vptr->push(out, strlen(desc)+1, desc);
	}
	/* finish message */
	if (len < 0 || (len = out->_vptr->push(out, 0, 0)) < 0) {
		out->_vptr->push(out, 1, 0);
		return len;
	}
	/* wait for answers to queries */
	out->_vptr->sync(out, -1);
	
	/* answer not arrived within call */
	if (lid < 0) {
		return 0;
	}
	return lid;
}